

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O2

void __thiscall ipv4_address::ipv4_address(ipv4_address *this,string *text)

{
  int iVar1;
  ostream *poVar2;
  runtime_error *this_00;
  in_addr tmp;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  tmp.s_addr = 0;
  iVar1 = inet_pton(2,(text->_M_dataplus)._M_p,&tmp);
  if (iVar1 != 0) {
    this->addr_net = tmp.s_addr;
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_190,'\'');
  poVar2 = std::operator<<(poVar2,(string *)text);
  std::operator<<(poVar2,"\' is not a valid ip address");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,local_1c0);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ipv4_address::ipv4_address(const std::string &text)
{
    in_addr tmp{};
    int res = inet_pton(AF_INET, text.c_str(), &tmp);
    if (res == 0)
    {
        std::stringstream ss;
        ss << '\'' << text << "' is not a valid ip address";
        throw std::runtime_error(ss.str());
    }
    addr_net = tmp.s_addr;
}